

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON__UINT32 __thiscall ON_Mesh::DataCRC(ON_Mesh *this,ON__UINT32 current_remainder)

{
  ON__UINT32 OVar1;
  
  OVar1 = ON_CRC32(current_remainder,
                   (long)(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count * 0xc,
                   (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a);
  OVar1 = ON_CRC32(OVar1,(long)(this->m_F).m_count << 4,(this->m_F).m_a);
  OVar1 = ON_CRC32(OVar1,(long)(this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count * 0xc,
                   (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a);
  return OVar1;
}

Assistant:

ON__UINT32 ON_Mesh::DataCRC(ON__UINT32 current_remainder) const
{
  const ON_3fPoint* p = m_V.Array();
  current_remainder = ON_CRC32(current_remainder,m_V.Count()*sizeof(p[0]),p);
  current_remainder = ON_CRC32(current_remainder,m_F.Count()*sizeof(ON_MeshFace),m_F.Array());
  const ON_3fVector* v = m_N.Array();
  current_remainder = ON_CRC32(current_remainder,m_N.Count()*sizeof(v[0]),v);
  return current_remainder;
}